

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>::
find<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks> *this,
          ArrayPtr<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> table,
          uint *params)

{
  int iVar1;
  int iVar2;
  SegmentReader *pSVar3;
  uint uVar4;
  ulong uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  Entry *pEVar7;
  int *in_R8;
  Maybe<unsigned_long> MVar8;
  
  pEVar7 = table.ptr;
  aVar6.value = table.size_;
  if (*(long *)(pEVar7 + 1) != 0) {
    iVar1 = *in_R8;
    uVar4 = _::chooseBucket((uint)(iVar1 != 0),(uint)*(long *)(pEVar7 + 1));
    pSVar3 = (pEVar7->value).ptr;
    aVar6 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pEVar7 + 1))->value;
    while( true ) {
      uVar5 = (ulong)uVar4;
      iVar2 = *(int *)((long)&pSVar3->arena + uVar5 * 8 + 4);
      if (iVar2 == 0) break;
      if (((iVar2 != 1) && (*(uint *)(&pSVar3->arena + uVar5) == (uint)(iVar1 != 0))) &&
         (*(int *)(table.size_ + (ulong)(iVar2 - 2) * 0x18) == *in_R8)) {
        *this = (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)
                0x1;
        *(ulong *)(this + 8) = (ulong)(iVar2 - 2);
        goto LAB_00286c19;
      }
      uVar4 = (uint)(uVar5 + 1);
      if (uVar5 + 1 == aVar6.value) {
        uVar4 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)0x0;
LAB_00286c19:
  MVar8.ptr.field_1.value = aVar6.value;
  MVar8.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }